

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O0

void get_16n_coeff_contexts_2d
               (uint8_t *levels,int real_width,int real_height,int width,int height,
               ptrdiff_t *offsets,int8_t *coeff_contexts)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint8_t *puVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined8 *in_stack_00000008;
  int h;
  __m128i level [5];
  __m128i count;
  __m128i pos_to_offset_large [3];
  __m128i pos_to_offset [5];
  int col;
  int8_t *cc;
  int stride;
  int local_3bc;
  longlong local_3b8 [10];
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  int local_2d4;
  undefined8 *local_2d0;
  int local_2c4;
  ptrdiff_t *local_2c0;
  int local_2b8;
  uint8_t *local_2a8;
  undefined1 local_29a;
  undefined1 local_299;
  undefined1 local_298;
  undefined1 local_297;
  undefined1 local_296;
  undefined1 local_295;
  undefined1 local_294;
  undefined1 local_293;
  undefined1 local_292;
  undefined1 local_291;
  undefined1 local_290;
  undefined1 local_28f;
  undefined1 local_28e;
  undefined1 local_28d;
  undefined1 local_28c;
  undefined1 local_28b;
  undefined1 local_28a;
  undefined1 local_289;
  undefined1 local_288;
  undefined1 local_287;
  undefined1 local_286;
  undefined1 local_285;
  undefined1 local_284;
  undefined1 local_283;
  undefined1 local_282;
  undefined1 local_281;
  undefined1 local_280;
  undefined1 local_27f;
  undefined1 local_27e;
  undefined1 local_27d;
  undefined1 local_27c;
  undefined1 local_27b;
  undefined1 local_27a;
  undefined1 local_279;
  undefined1 local_278;
  undefined1 local_277;
  undefined1 local_276;
  undefined1 local_275;
  undefined1 local_274;
  undefined1 local_273;
  undefined1 local_272;
  undefined1 local_271;
  undefined1 local_270;
  undefined1 local_26f;
  undefined1 local_26e;
  undefined1 local_26d;
  undefined1 local_26c;
  undefined1 local_26b;
  undefined1 local_26a;
  undefined1 local_269;
  undefined1 local_268;
  undefined1 local_267;
  undefined1 local_266;
  undefined1 local_265;
  undefined1 local_264;
  undefined1 local_263;
  undefined1 local_262;
  undefined1 local_261;
  undefined1 local_260;
  undefined1 local_25f;
  undefined1 local_25e;
  undefined1 local_25d;
  undefined1 local_25c;
  undefined1 local_25b;
  undefined1 local_25a;
  undefined1 local_259;
  undefined1 local_258;
  undefined1 local_257;
  undefined1 local_256;
  undefined1 local_255;
  undefined1 local_254;
  undefined1 local_253;
  undefined1 local_252;
  undefined1 local_251;
  undefined1 local_250;
  undefined1 local_24f;
  undefined1 local_24e;
  undefined1 local_24d;
  undefined1 local_24c;
  undefined1 local_24b;
  undefined1 local_24a;
  undefined1 local_249;
  undefined1 local_248;
  undefined1 local_247;
  undefined1 local_246;
  undefined1 local_245;
  undefined1 local_244;
  undefined1 local_243;
  undefined1 local_242;
  undefined1 local_241;
  undefined1 local_240;
  undefined1 local_23f;
  undefined1 local_23e;
  undefined1 local_23d;
  undefined1 local_23c;
  undefined1 local_23b;
  undefined1 local_23a;
  undefined1 local_239;
  undefined1 local_238;
  undefined1 local_237;
  undefined1 local_236;
  undefined1 local_235;
  undefined1 local_234;
  undefined1 local_233;
  undefined1 local_232;
  undefined1 local_231;
  undefined1 local_230;
  undefined1 local_22f;
  undefined1 local_22e;
  undefined1 local_22d;
  undefined1 local_22c;
  undefined1 local_22b;
  undefined1 local_22a;
  undefined1 local_229;
  undefined1 local_228;
  undefined1 local_227;
  undefined1 local_226;
  undefined1 local_225;
  undefined1 local_224;
  undefined1 local_223;
  undefined1 local_222;
  undefined1 local_221;
  undefined1 local_220;
  undefined1 local_21f;
  undefined1 local_21e;
  undefined1 local_21d;
  undefined1 local_21c;
  undefined1 local_21b;
  undefined1 local_21a;
  undefined1 local_219;
  undefined1 local_218;
  undefined1 local_217;
  undefined1 local_216;
  undefined1 local_215;
  undefined1 local_214;
  undefined1 local_213;
  undefined1 local_212;
  undefined1 local_211;
  undefined1 local_210;
  undefined1 local_20f;
  undefined1 local_20e;
  undefined1 local_20d;
  undefined1 local_20c;
  undefined1 local_20b;
  undefined1 local_20a;
  undefined1 local_209;
  undefined1 local_208;
  undefined1 local_207;
  undefined1 local_206;
  undefined1 local_205;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  undefined1 local_200;
  undefined1 local_1ff;
  undefined1 local_1fe;
  undefined1 local_1fd;
  undefined1 local_1fc;
  undefined1 local_1fb;
  undefined1 local_1fa;
  undefined1 local_1f9;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  char local_1e8;
  char cStack_1e7;
  char cStack_1e6;
  char cStack_1e5;
  char cStack_1e4;
  char cStack_1e3;
  char cStack_1e2;
  char cStack_1e1;
  char cStack_1e0;
  char cStack_1df;
  char cStack_1de;
  char cStack_1dd;
  char cStack_1dc;
  char cStack_1db;
  char cStack_1da;
  char cStack_1d9;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8;
  undefined1 local_1a7;
  undefined1 local_1a6;
  undefined1 local_1a5;
  undefined1 local_1a4;
  undefined1 local_1a3;
  undefined1 local_1a2;
  undefined1 local_1a1;
  undefined1 local_1a0;
  undefined1 local_19f;
  undefined1 local_19e;
  undefined1 local_19d;
  undefined1 local_19c;
  undefined1 local_19b;
  undefined1 local_19a;
  undefined1 local_199;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188;
  undefined1 local_187;
  undefined1 local_186;
  undefined1 local_185;
  undefined1 local_184;
  undefined1 local_183;
  undefined1 local_182;
  undefined1 local_181;
  undefined1 local_180;
  undefined1 local_17f;
  undefined1 local_17e;
  undefined1 local_17d;
  undefined1 local_17c;
  undefined1 local_17b;
  undefined1 local_17a;
  undefined1 local_179;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168;
  undefined1 local_167;
  undefined1 local_166;
  undefined1 local_165;
  undefined1 local_164;
  undefined1 local_163;
  undefined1 local_162;
  undefined1 local_161;
  undefined1 local_160;
  undefined1 local_15f;
  undefined1 local_15e;
  undefined1 local_15d;
  undefined1 local_15c;
  undefined1 local_15b;
  undefined1 local_15a;
  undefined1 local_159;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148;
  undefined1 local_147;
  undefined1 local_146;
  undefined1 local_145;
  undefined1 local_144;
  undefined1 local_143;
  undefined1 local_142;
  undefined1 local_141;
  undefined1 local_140;
  undefined1 local_13f;
  undefined1 local_13e;
  undefined1 local_13d;
  undefined1 local_13c;
  undefined1 local_13b;
  undefined1 local_13a;
  undefined1 local_139;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128;
  undefined1 local_127;
  undefined1 local_126;
  undefined1 local_125;
  undefined1 local_124;
  undefined1 local_123;
  undefined1 local_122;
  undefined1 local_121;
  undefined1 local_120;
  undefined1 local_11f;
  undefined1 local_11e;
  undefined1 local_11d;
  undefined1 local_11c;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108;
  undefined1 local_107;
  undefined1 local_106;
  undefined1 local_105;
  undefined1 local_104;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  undefined1 local_100;
  undefined1 local_ff;
  undefined1 local_fe;
  undefined1 local_fd;
  undefined1 local_fc;
  undefined1 local_fb;
  undefined1 local_fa;
  undefined1 local_f9;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8;
  undefined1 local_e7;
  undefined1 local_e6;
  undefined1 local_e5;
  undefined1 local_e4;
  undefined1 local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  undefined1 local_e0;
  undefined1 local_df;
  undefined1 local_de;
  undefined1 local_dd;
  undefined1 local_dc;
  undefined1 local_db;
  undefined1 local_da;
  undefined1 local_d9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  local_2c0 = (ptrdiff_t *)CONCAT71(in_register_00000089,in_R9B);
  local_2c4 = in_R8D + 4;
  local_2d0 = in_stack_00000008;
  local_299 = 0x15;
  local_59 = 0x15;
  local_5a = 0x15;
  local_5b = 0x15;
  local_5c = 0x15;
  local_5d = 0x15;
  local_5e = 0x15;
  local_5f = 0x15;
  local_60 = 0x15;
  local_61 = 0x15;
  local_62 = 0x15;
  local_63 = 0x15;
  local_64 = 0x15;
  local_65 = 0x15;
  local_66 = 0x15;
  local_67 = 0x15;
  local_68 = 0x15;
  local_338 = 0x1515151515151515;
  uStack_330 = 0x1515151515151515;
  local_348 = local_338;
  uStack_340 = uStack_330;
  local_2e8 = local_338;
  if (in_ESI == in_EDX) {
    local_1f9 = 0;
    local_1fa = 1;
    local_1fb = 6;
    local_1fc = 6;
    local_1fd = 0x15;
    local_1fe = 0x15;
    local_1ff = 0x15;
    local_200 = 0x15;
    local_201 = 0x15;
    local_202 = 0x15;
    local_203 = 0x15;
    local_204 = 0x15;
    local_205 = 0x15;
    local_206 = 0x15;
    local_207 = 0x15;
    local_208 = 0x15;
    local_199 = 0x15;
    local_19a = 0x15;
    local_19b = 0x15;
    local_19c = 0x15;
    local_19d = 0x15;
    local_19e = 0x15;
    local_19f = 0x15;
    local_1a0 = 0x15;
    local_1a1 = 0x15;
    local_1a2 = 0x15;
    local_1a3 = 0x15;
    local_1a4 = 0x15;
    local_1a5 = 6;
    local_1a6 = 6;
    local_1a7 = 1;
    local_1a8 = 0;
    local_328 = 0x1515151506060100;
    uStack_1b0 = 0x1515151515151515;
    local_209 = 1;
    local_20a = 6;
    local_20b = 6;
    local_20c = 0x15;
    local_20d = 0x15;
    local_20e = 0x15;
    local_20f = 0x15;
    local_210 = 0x15;
    local_211 = 0x15;
    local_212 = 0x15;
    local_213 = 0x15;
    local_214 = 0x15;
    local_215 = 0x15;
    local_216 = 0x15;
    local_217 = 0x15;
    local_218 = 0x15;
    local_179 = 0x15;
    local_17a = 0x15;
    local_17b = 0x15;
    local_17c = 0x15;
    local_17d = 0x15;
    local_17e = 0x15;
    local_17f = 0x15;
    local_180 = 0x15;
    local_181 = 0x15;
    local_182 = 0x15;
    local_183 = 0x15;
    local_184 = 0x15;
    local_185 = 0x15;
    local_186 = 6;
    local_187 = 6;
    local_188 = 1;
    local_318 = 0x1515151515060601;
    uStack_310 = 0x1515151515151515;
    local_219 = 6;
    local_21a = 6;
    local_21b = 0x15;
    local_21c = 0x15;
    local_21d = 0x15;
    local_21e = 0x15;
    local_21f = 0x15;
    local_220 = 0x15;
    local_221 = 0x15;
    local_222 = 0x15;
    local_223 = 0x15;
    local_224 = 0x15;
    local_225 = 0x15;
    local_226 = 0x15;
    local_227 = 0x15;
    local_228 = 0x15;
    local_159 = 0x15;
    local_15a = 0x15;
    local_15b = 0x15;
    local_15c = 0x15;
    local_15d = 0x15;
    local_15e = 0x15;
    local_15f = 0x15;
    local_160 = 0x15;
    local_161 = 0x15;
    local_162 = 0x15;
    local_163 = 0x15;
    local_164 = 0x15;
    local_165 = 0x15;
    local_166 = 0x15;
    local_167 = 6;
    local_168 = 6;
    local_308 = 0x1515151515150606;
    uStack_170 = 0x1515151515151515;
    local_229 = 6;
    local_22a = 0x15;
    local_22b = 0x15;
    local_22c = 0x15;
    local_22d = 0x15;
    local_22e = 0x15;
    local_22f = 0x15;
    local_230 = 0x15;
    local_231 = 0x15;
    local_232 = 0x15;
    local_233 = 0x15;
    local_234 = 0x15;
    local_235 = 0x15;
    local_236 = 0x15;
    local_237 = 0x15;
    local_238 = 0x15;
    local_139 = 0x15;
    local_13a = 0x15;
    local_13b = 0x15;
    local_13c = 0x15;
    local_13d = 0x15;
    local_13e = 0x15;
    local_13f = 0x15;
    local_140 = 0x15;
    local_141 = 0x15;
    local_142 = 0x15;
    local_143 = 0x15;
    local_144 = 0x15;
    local_145 = 0x15;
    local_146 = 0x15;
    local_147 = 0x15;
    local_148 = 6;
    local_2f8 = 0x1515151515151506;
    uStack_150 = 0x1515151515151515;
    local_1b8 = local_328;
    local_198 = local_318;
    uStack_190 = uStack_310;
    local_178 = local_308;
    local_158 = local_2f8;
  }
  else if (in_ESI < in_EDX) {
    local_239 = 0;
    local_23a = 0xb;
    local_23b = 6;
    local_23c = 6;
    local_23d = 0x15;
    local_23e = 0x15;
    local_23f = 0x15;
    local_240 = 0x15;
    local_241 = 0x15;
    local_242 = 0x15;
    local_243 = 0x15;
    local_244 = 0x15;
    local_245 = 0x15;
    local_246 = 0x15;
    local_247 = 0x15;
    local_248 = 0x15;
    local_119 = 0x15;
    local_11a = 0x15;
    local_11b = 0x15;
    local_11c = 0x15;
    local_11d = 0x15;
    local_11e = 0x15;
    local_11f = 0x15;
    local_120 = 0x15;
    local_121 = 0x15;
    local_122 = 0x15;
    local_123 = 0x15;
    local_124 = 0x15;
    local_125 = 6;
    local_126 = 6;
    local_127 = 0xb;
    local_128 = 0;
    local_328 = 0x1515151506060b00;
    uStack_130 = 0x1515151515151515;
    local_249 = 0xb;
    local_24a = 0xb;
    local_24b = 6;
    local_24c = 0x15;
    local_24d = 0x15;
    local_24e = 0x15;
    local_24f = 0x15;
    local_250 = 0x15;
    local_251 = 0x15;
    local_252 = 0x15;
    local_253 = 0x15;
    local_254 = 0x15;
    local_255 = 0x15;
    local_256 = 0x15;
    local_257 = 0x15;
    local_258 = 0x15;
    local_f9 = 0x15;
    local_fa = 0x15;
    local_fb = 0x15;
    local_fc = 0x15;
    local_fd = 0x15;
    local_fe = 0x15;
    local_ff = 0x15;
    local_100 = 0x15;
    local_101 = 0x15;
    local_102 = 0x15;
    local_103 = 0x15;
    local_104 = 0x15;
    local_105 = 0x15;
    local_106 = 6;
    local_107 = 0xb;
    local_108 = 0xb;
    local_318 = 0x1515151515060b0b;
    uStack_310 = 0x1515151515151515;
    local_259 = 0xb;
    local_25a = 0xb;
    local_25b = 0x15;
    local_25c = 0x15;
    local_25d = 0x15;
    local_25e = 0x15;
    local_25f = 0x15;
    local_260 = 0x15;
    local_261 = 0x15;
    local_262 = 0x15;
    local_263 = 0x15;
    local_264 = 0x15;
    local_265 = 0x15;
    local_266 = 0x15;
    local_267 = 0x15;
    local_268 = 0x15;
    local_d9 = 0x15;
    local_da = 0x15;
    local_db = 0x15;
    local_dc = 0x15;
    local_dd = 0x15;
    local_de = 0x15;
    local_df = 0x15;
    local_e0 = 0x15;
    local_e1 = 0x15;
    local_e2 = 0x15;
    local_e3 = 0x15;
    local_e4 = 0x15;
    local_e5 = 0x15;
    local_e6 = 0x15;
    local_e7 = 0xb;
    local_e8 = 0xb;
    local_308 = 0x1515151515150b0b;
    uStack_f0 = 0x1515151515151515;
    local_2f8 = local_308;
    local_2e8 = local_308;
    local_138 = local_328;
    local_118 = local_318;
    uStack_110 = uStack_310;
    local_f8 = local_308;
  }
  else {
    local_269 = 0x10;
    local_26a = 0x10;
    local_26b = 0x10;
    local_26c = 0x10;
    local_26d = 0x10;
    local_26e = 0x10;
    local_26f = 0x10;
    local_270 = 0x10;
    local_271 = 0x10;
    local_272 = 0x10;
    local_273 = 0x10;
    local_274 = 0x10;
    local_275 = 0x10;
    local_276 = 0x10;
    local_277 = 0x10;
    local_278 = 0x10;
    local_b9 = 0x10;
    local_ba = 0x10;
    local_bb = 0x10;
    local_bc = 0x10;
    local_bd = 0x10;
    local_be = 0x10;
    local_bf = 0x10;
    local_c0 = 0x10;
    local_c1 = 0x10;
    local_c2 = 0x10;
    local_c3 = 0x10;
    local_c4 = 0x10;
    local_c5 = 0x10;
    local_c6 = 0x10;
    local_c7 = 0x10;
    local_c8 = 0x10;
    local_328 = 0x1010101010101010;
    uStack_310 = 0x1010101010101010;
    local_279 = 6;
    local_27a = 6;
    local_27b = 0x15;
    local_27c = 0x15;
    local_27d = 0x15;
    local_27e = 0x15;
    local_27f = 0x15;
    local_280 = 0x15;
    local_281 = 0x15;
    local_282 = 0x15;
    local_283 = 0x15;
    local_284 = 0x15;
    local_285 = 0x15;
    local_286 = 0x15;
    local_287 = 0x15;
    local_288 = 0x15;
    local_99 = 0x15;
    local_9a = 0x15;
    local_9b = 0x15;
    local_9c = 0x15;
    local_9d = 0x15;
    local_9e = 0x15;
    local_9f = 0x15;
    local_a0 = 0x15;
    local_a1 = 0x15;
    local_a2 = 0x15;
    local_a3 = 0x15;
    local_a4 = 0x15;
    local_a5 = 0x15;
    local_a6 = 0x15;
    local_a7 = 6;
    local_a8 = 6;
    local_308 = 0x1515151515150606;
    uStack_b0 = 0x1515151515151515;
    local_289 = 6;
    local_28a = 0x15;
    local_28b = 0x15;
    local_28c = 0x15;
    local_28d = 0x15;
    local_28e = 0x15;
    local_28f = 0x15;
    local_290 = 0x15;
    local_291 = 0x15;
    local_292 = 0x15;
    local_293 = 0x15;
    local_294 = 0x15;
    local_295 = 0x15;
    local_296 = 0x15;
    local_297 = 0x15;
    local_298 = 0x15;
    local_79 = 0x15;
    local_7a = 0x15;
    local_7b = 0x15;
    local_7c = 0x15;
    local_7d = 0x15;
    local_7e = 0x15;
    local_7f = 0x15;
    local_80 = 0x15;
    local_81 = 0x15;
    local_82 = 0x15;
    local_83 = 0x15;
    local_84 = 0x15;
    local_85 = 0x15;
    local_86 = 0x15;
    local_87 = 0x15;
    local_88 = 6;
    local_2f8 = 0x1515151515151506;
    uStack_90 = 0x1515151515151515;
    local_29a = 0x10;
    local_31 = 0x10;
    local_32 = 0x10;
    local_33 = 0x10;
    local_34 = 0x10;
    local_35 = 0x10;
    local_36 = 0x10;
    local_37 = 0x10;
    local_38 = 0x10;
    local_39 = 0x10;
    local_3a = 0x10;
    local_3b = 0x10;
    local_3c = 0x10;
    local_3d = 0x10;
    local_3e = 0x10;
    local_3f = 0x10;
    local_40 = 0x10;
    local_348 = 0x1010101010101010;
    uStack_340 = 0x1010101010101010;
    local_318 = local_328;
    local_d8 = local_328;
    uStack_d0 = uStack_310;
    local_b8 = local_308;
    local_98 = local_2f8;
    local_58 = local_348;
    uStack_50 = uStack_340;
  }
  uStack_2e0 = 0x1515151515151515;
  uStack_300 = 0x1515151515151515;
  local_358 = local_348;
  uStack_350 = uStack_340;
  uStack_320 = uStack_310;
  local_2d4 = in_ECX;
  local_2b8 = in_R8D;
  local_2a8 = in_RDI;
  local_78 = local_338;
  uStack_70 = uStack_330;
  do {
    local_3bc = local_2b8;
    uStack_2f0 = uStack_2e0;
    puVar3 = local_2a8;
    do {
      local_2a8 = puVar3;
      load_levels_16x1x5_sse2(local_2a8,local_2c4,local_2c0,(__m128i *)local_3b8);
      get_coeff_contexts_kernel_sse2((__m128i *)local_3b8);
      uVar1 = local_328;
      uVar2 = uStack_320;
      local_1e8 = (char)extraout_XMM0_Qa;
      cStack_1e7 = (char)((ulong)extraout_XMM0_Qa >> 8);
      cStack_1e6 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
      cStack_1e5 = (char)((ulong)extraout_XMM0_Qa >> 0x18);
      cStack_1e4 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
      cStack_1e3 = (char)((ulong)extraout_XMM0_Qa >> 0x28);
      cStack_1e2 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
      cStack_1e1 = (char)((ulong)extraout_XMM0_Qa >> 0x38);
      cStack_1e0 = (char)extraout_XMM0_Qb;
      cStack_1df = (char)((ulong)extraout_XMM0_Qb >> 8);
      cStack_1de = (char)((ulong)extraout_XMM0_Qb >> 0x10);
      cStack_1dd = (char)((ulong)extraout_XMM0_Qb >> 0x18);
      cStack_1dc = (char)((ulong)extraout_XMM0_Qb >> 0x20);
      cStack_1db = (char)((ulong)extraout_XMM0_Qb >> 0x28);
      cStack_1da = (char)((ulong)extraout_XMM0_Qb >> 0x30);
      cStack_1d9 = (char)((ulong)extraout_XMM0_Qb >> 0x38);
      local_1f8._0_1_ = (char)local_328;
      local_1f8._1_1_ = (char)((ulong)local_328 >> 8);
      local_1f8._2_1_ = (char)((ulong)local_328 >> 0x10);
      local_1f8._3_1_ = (char)((ulong)local_328 >> 0x18);
      local_1f8._4_1_ = (char)((ulong)local_328 >> 0x20);
      local_1f8._5_1_ = (char)((ulong)local_328 >> 0x28);
      local_1f8._6_1_ = (char)((ulong)local_328 >> 0x30);
      local_1f8._7_1_ = (char)((ulong)local_328 >> 0x38);
      uStack_1f0._0_1_ = (char)uStack_320;
      uStack_1f0._1_1_ = (char)((ulong)uStack_320 >> 8);
      uStack_1f0._2_1_ = (char)((ulong)uStack_320 >> 0x10);
      uStack_1f0._3_1_ = (char)((ulong)uStack_320 >> 0x18);
      uStack_1f0._4_1_ = (char)((ulong)uStack_320 >> 0x20);
      uStack_1f0._5_1_ = (char)((ulong)uStack_320 >> 0x28);
      uStack_1f0._6_1_ = (char)((ulong)uStack_320 >> 0x30);
      uStack_1f0._7_1_ = (char)((ulong)uStack_320 >> 0x38);
      local_368 = CONCAT17(cStack_1e1 + local_1f8._7_1_,
                           CONCAT16(cStack_1e2 + local_1f8._6_1_,
                                    CONCAT15(cStack_1e3 + local_1f8._5_1_,
                                             CONCAT14(cStack_1e4 + local_1f8._4_1_,
                                                      CONCAT13(cStack_1e5 + local_1f8._3_1_,
                                                               CONCAT12(cStack_1e6 + local_1f8._2_1_
                                                                        ,CONCAT11(cStack_1e7 +
                                                                                  local_1f8._1_1_,
                                                                                  local_1e8 +
                                                                                  (char)local_1f8)))
                                                     ))));
      uStack_360 = CONCAT17(cStack_1d9 + uStack_1f0._7_1_,
                            CONCAT16(cStack_1da + uStack_1f0._6_1_,
                                     CONCAT15(cStack_1db + uStack_1f0._5_1_,
                                              CONCAT14(cStack_1dc + uStack_1f0._4_1_,
                                                       CONCAT13(cStack_1dd + uStack_1f0._3_1_,
                                                                CONCAT12(cStack_1de +
                                                                         uStack_1f0._2_1_,
                                                                         CONCAT11(cStack_1df +
                                                                                  uStack_1f0._1_1_,
                                                                                  cStack_1e0 +
                                                                                  (char)uStack_1f0))
                                                               )))));
      local_1c0 = local_2d0;
      local_1d8 = local_368;
      uStack_1d0 = uStack_360;
      *local_2d0 = local_368;
      local_2d0[1] = uStack_360;
      local_2d0 = local_2d0 + 2;
      local_3bc = local_3bc + -0x10;
      local_328 = local_358;
      uStack_320 = uStack_350;
      puVar3 = local_2a8 + 0x10;
      local_1f8 = uVar1;
      uStack_1f0 = uVar2;
    } while (local_3bc != 0);
    local_328 = local_318;
    uStack_320 = uStack_310;
    local_318 = local_308;
    uStack_310 = uStack_300;
    local_308 = local_2f8;
    uStack_300 = uStack_2f0;
    local_2f8 = local_2e8;
    local_358 = local_348;
    uStack_350 = uStack_340;
    local_348 = local_338;
    uStack_340 = uStack_330;
    local_2a8 = local_2a8 + 0x14;
    local_2d4 = local_2d4 + -1;
  } while (local_2d4 != 0);
  *(undefined1 *)in_stack_00000008 = 0;
  return;
}

Assistant:

static inline void get_16n_coeff_contexts_2d(const uint8_t *levels,
                                             const int real_width,
                                             const int real_height,
                                             const int width, const int height,
                                             const ptrdiff_t *const offsets,
                                             int8_t *coeff_contexts) {
  const int stride = height + TX_PAD_HOR;
  int8_t *cc = coeff_contexts;
  int col = width;
  __m128i pos_to_offset[5];
  __m128i pos_to_offset_large[3];
  __m128i count;
  __m128i level[5];

  assert(!(height % 16));

  pos_to_offset_large[2] = _mm_set1_epi8(21);
  if (real_width == real_height) {
    pos_to_offset[0] = _mm_setr_epi8(0, 1, 6, 6, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21);
    pos_to_offset[1] = _mm_setr_epi8(1, 6, 6, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[2] = _mm_setr_epi8(6, 6, 21, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[3] = _mm_setr_epi8(6, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[4] = pos_to_offset_large[0] = pos_to_offset_large[1] =
        pos_to_offset_large[2];
  } else if (real_width < real_height) {
    pos_to_offset[0] = _mm_setr_epi8(0, 11, 6, 6, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[1] = _mm_setr_epi8(11, 11, 6, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[2] = pos_to_offset[3] = pos_to_offset[4] = _mm_setr_epi8(
        11, 11, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21);
    pos_to_offset_large[0] = pos_to_offset_large[1] = pos_to_offset_large[2];
  } else {  // real_width > real_height
    pos_to_offset[0] = pos_to_offset[1] = _mm_setr_epi8(
        16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16);
    pos_to_offset[2] = _mm_setr_epi8(6, 6, 21, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[3] = _mm_setr_epi8(6, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[4] = pos_to_offset_large[2];
    pos_to_offset_large[0] = pos_to_offset_large[1] = _mm_set1_epi8(16);
  }

  do {
    int h = height;

    do {
      load_levels_16x1x5_sse2(levels, stride, offsets, level);
      count = get_coeff_contexts_kernel_sse2(level);
      count = _mm_add_epi8(count, pos_to_offset[0]);
      _mm_store_si128((__m128i *)cc, count);
      levels += 16;
      cc += 16;
      h -= 16;
      pos_to_offset[0] = pos_to_offset_large[0];
    } while (h);

    pos_to_offset[0] = pos_to_offset[1];
    pos_to_offset[1] = pos_to_offset[2];
    pos_to_offset[2] = pos_to_offset[3];
    pos_to_offset[3] = pos_to_offset[4];
    pos_to_offset_large[0] = pos_to_offset_large[1];
    pos_to_offset_large[1] = pos_to_offset_large[2];
    levels += TX_PAD_HOR;
  } while (--col);

  coeff_contexts[0] = 0;
}